

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vfnmadd213ps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  undefined8 uVar2;
  
  if ((pMyDisasm->Prefix).OperandSize != '\x01') {
LAB_0012b37f:
    failDecode(pMyDisasm);
    return;
  }
  (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
  (pMyDisasm->Prefix).OperandSize = '\b';
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar1 == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
  }
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') goto LAB_0012b37f;
  if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
    if (UVar1 == '\x01') goto LAB_0012b38c;
LAB_0012b3a1:
    uVar2 = 0x73703331326464;
  }
  else {
    if (UVar1 == '\x01') {
LAB_0012b38c:
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') goto LAB_0012b3a1;
    }
    uVar2 = 0x64703331326464;
  }
  *(undefined8 *)((pMyDisasm->Instruction).Mnemonic + 5) = uVar2;
  (pMyDisasm->Instruction).Mnemonic[0] = 'v';
  (pMyDisasm->Instruction).Mnemonic[1] = 'f';
  (pMyDisasm->Instruction).Mnemonic[2] = 'n';
  (pMyDisasm->Instruction).Mnemonic[3] = 'm';
  (pMyDisasm->Instruction).Mnemonic[4] = 'a';
  (pMyDisasm->Instruction).Mnemonic[5] = 'd';
  (pMyDisasm->Instruction).Mnemonic[6] = 'd';
  (pMyDisasm->Instruction).Mnemonic[7] = '2';
  ArgsVEX(pMyDisasm);
  (pMyDisasm->Operand1).AccessMode = 3;
  return;
}

Assistant:

void __bea_callspec__ vfnmadd213ps_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
       if (GV.VEX.state == InUsePrefix) {
         if (((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) || ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))) {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfnmadd213ps");
           #endif
         } else {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfnmadd213pd");
           #endif

         }
         ArgsVEX(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;
       } else {
         failDecode(pMyDisasm);
       }
   }
   else {
       failDecode(pMyDisasm);
   }
}